

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

Reference<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
          (Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
           *this,CordRep **args)

{
  CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>
  CVar1;
  Pointer<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> ppCVar2;
  ulong uVar3;
  ulong uVar4;
  Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
  *pSVar5;
  SizeType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> SVar6;
  AllocationTransaction<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> AStack_38;
  
  uVar3 = *(ulong *)this;
  if ((uVar3 & 1) == 0) {
    uVar4 = 2;
  }
  else {
    uVar4 = *(ulong *)(this + 0x10);
  }
  if (uVar3 >> 1 != uVar4) {
    if ((uVar3 & 1) == 0) {
      pSVar5 = this + 8;
    }
    else {
      pSVar5 = *(Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                 **)(this + 8);
    }
    *(ValueType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> *)
     (pSVar5 + (uVar3 >> 1) * 8) = *args;
    *(ulong *)this = uVar3 + 2;
    return (Reference<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>)
           (pSVar5 + (uVar3 >> 1) * 8);
  }
  uVar3 = *(ulong *)this;
  pSVar5 = *(Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
             **)(this + 8);
  AStack_38.allocator_data_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>.value =
       (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>)0x0;
  AStack_38.capacity_ = 0;
  SVar6 = 4;
  if ((uVar3 & 1) != 0) {
    SVar6 = *(long *)(this + 0x10) * 2;
  }
  ppCVar2 = AllocationTransaction<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>::
            Allocate(&AStack_38,SVar6);
  uVar4 = uVar3 >> 1;
  if ((uVar3 & 1) == 0) {
    pSVar5 = this + 8;
  }
  ppCVar2[uVar4] = *args;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined8 *)
     ((long)AStack_38.allocator_data_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>.value +
     uVar3 * 8) = *(undefined8 *)(pSVar5 + uVar3 * 8);
  }
  Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  ::DeallocateIfAllocated
            ((Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
              *)this);
  SVar6 = AStack_38.capacity_;
  CVar1.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>.value =
       AStack_38.allocator_data_.
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>.value;
  AStack_38.allocator_data_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>.value =
       (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>)0x0;
  AStack_38.capacity_ = 0;
  *(CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    *)(this + 8) =
       CVar1.
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_absl::lts_20250127::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<absl::lts_20250127::cord_internal::CordRep_**,_1UL,_false>.value;
  *(SizeType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> *)(this + 0x10) = SVar6;
  *(ulong *)this = (*(ulong *)this | 1) + 2;
  AllocationTransaction<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>::
  ~AllocationTransaction(&AStack_38);
  return ppCVar2 + uVar4;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }